

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

void __thiscall
soul::HTMLGenerator::appendSpansForContent
          (HTMLGenerator *this,HTMLElement *parent,string_view markdown)

{
  HTMLElement *pHVar1;
  undefined8 this_00;
  undefined1 *puVar2;
  char *pcVar3;
  HTMLElement *pHVar4;
  ulong uVar5;
  long lVar6;
  HTMLElement *parent_00;
  HTMLElement *pHVar7;
  ulong *puVar8;
  string_view text;
  string_view markdown_00;
  string_view markdown_01;
  DelimitedSection range;
  ArrayWithPreallocation<FoundDelimiter,_4UL> found;
  undefined8 local_108;
  undefined8 uStack_100;
  pointer local_f8;
  HTMLElement *local_f0;
  HTMLElement *pHStack_e8;
  undefined1 local_e0 [32];
  ulong local_c0;
  pointer local_b8;
  HTMLElement local_b0;
  
  markdown_00._M_len = (HTMLElement *)markdown._M_len;
  local_e0._16_8_ = this;
  if (appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
      ::delimiterTypes == '\0') {
    appendSpansForContent();
  }
  local_e0._24_8_ = &local_b0;
  local_c0 = 0;
  local_b8 = (pointer)0x4;
  lVar6 = 0;
  do {
    local_108 = parent;
    uStack_100 = markdown_00._M_len;
    if (*(long *)((long)&appendSpansForContent::delimiterTypes[0].findNextMatch.super__Function_base
                         ._M_manager + lVar6) == 0) {
      std::__throw_bad_function_call();
    }
    pcVar3 = appendSpansForContent::delimiterTypes[0].findNextMatch.super__Function_base._M_functor.
             _M_pod_data + lVar6;
    (**(code **)((long)&appendSpansForContent::delimiterTypes[0].findNextMatch._M_invoker + lVar6))
              (&local_f0,pcVar3,&local_108);
    if (local_f0 < pHStack_e8) {
      local_f8 = (pointer)local_e0._0_8_;
      local_108 = local_f0;
      uStack_100 = pHStack_e8;
      ArrayWithPreallocation<FoundDelimiter,_4UL>::reserve
                ((ArrayWithPreallocation<FoundDelimiter,_4UL> *)(local_e0 + 0x18),local_c0 + 1);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_e0._24_8_ + 0x10))[local_c0 * 2]._M_allocated_capacity = (size_type)local_f8;
      puVar8 = (ulong *)(local_e0._24_8_ + local_c0 * 0x20);
      *(undefined4 *)puVar8 = (undefined4)local_108;
      *(undefined4 *)((long)puVar8 + 4) = local_108._4_4_;
      *(undefined4 *)(puVar8 + 1) = (undefined4)uStack_100;
      *(undefined4 *)((long)puVar8 + 0xc) = uStack_100._4_4_;
      ((ulong *)(local_e0._24_8_ + 0x18))[local_c0 * 4] = (ulong)pcVar3;
      local_c0 = local_c0 + 1;
    }
    pHVar7 = (HTMLElement *)local_e0._24_8_;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x100);
  if (local_c0 == 0) {
    if (parent != (HTMLElement *)0x0) {
      text._M_str = (char *)markdown_00._M_len;
      text._M_len = (size_t)parent;
      choc::html::HTMLElement::addContent((HTMLElement *)local_e0._16_8_,text);
    }
LAB_00250c95:
    local_c0._0_1_ = false;
    local_c0._1_1_ = false;
    local_c0._2_6_ = 0;
    if (((pointer)0x4 < local_b8) && ((HTMLElement *)local_e0._24_8_ != (HTMLElement *)0x0)) {
      operator_delete__((void *)local_e0._24_8_);
    }
    return;
  }
  lVar6 = 0x3f;
  if (local_c0 != 0) {
    for (; local_c0 >> lVar6 == 0; lVar6 = lVar6 + -1) {
    }
  }
  puVar8 = (ulong *)(local_c0 * 0x20 + local_e0._24_8_);
  std::
  __introsort_loop<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::FoundDelimiter*,long,__gnu_cxx::__ops::_Iter_less_iter>
            (local_e0._24_8_,puVar8,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
  std::
  __final_insertion_sort<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::FoundDelimiter*,__gnu_cxx::__ops::_Iter_less_iter>
            (pHVar7,puVar8);
  if (local_c0 == 0) {
    throwInternalCompilerError("! empty()","front",0xa7);
  }
  pHVar4 = *(HTMLElement **)local_e0._24_8_;
  parent_00 = pHVar4;
  if (parent < pHVar4) {
    parent_00 = parent;
  }
  pHVar1 = (HTMLElement *)
           ((long)&(pHVar4->name)._M_dataplus._M_p +
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_e0._24_8_ + 0x10))->_M_allocated_capacity);
  if (parent < pHVar1) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pHVar1
               ,parent);
  }
  else {
    pHVar7 = *(HTMLElement **)(local_e0._24_8_ + 8);
    pcVar3 = (char *)((long)&(pHVar4->name)._M_dataplus._M_p +
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_e0._24_8_ + 0x10))->_M_allocated_capacity * 2);
    uVar5 = (long)pHVar7 - (long)pcVar3;
    if ((ulong)((long)parent - (long)pHVar1) < (ulong)((long)pHVar7 - (long)pcVar3)) {
      uVar5 = (long)parent - (long)pHVar1;
    }
    puVar2 = (undefined1 *)
             ((long)&((markdown_00._M_len)->name)._M_dataplus._M_p +
             (long)&(pHVar1->name)._M_dataplus._M_p);
    local_f0 = (HTMLElement *)local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,puVar2,puVar2 + uVar5);
    this_00 = local_e0._16_8_;
    if (pHVar7 <= parent) {
      markdown_00._M_str = pcVar3;
      appendSpansForContent((HTMLGenerator *)local_e0._16_8_,parent_00,markdown_00);
      if (local_c0 != 0) {
        uVar5 = *(ulong *)(local_e0._24_8_ + 0x18);
        local_108 = pHStack_e8;
        uStack_100 = local_f0;
        if (*(long *)(uVar5 + 0x30) == 0) {
          std::__throw_bad_function_call();
        }
        pHVar4 = local_f0;
        (**(code **)(uVar5 + 0x38))(uVar5 + 0x20,this_00,&local_108);
        markdown_01._M_len =
             (undefined1 *)
             ((long)&(pHVar7->name)._M_dataplus._M_p +
             (long)&((markdown_00._M_len)->name)._M_dataplus._M_p);
        markdown_01._M_str = (char *)pHVar4;
        appendSpansForContent
                  ((HTMLGenerator *)this_00,(HTMLElement *)((long)parent - (long)pHVar7),markdown_01
                  );
        if (local_f0 != (HTMLElement *)local_e0) {
          operator_delete(local_f0,(ulong)(local_e0._0_8_ + 1));
        }
        goto LAB_00250c95;
      }
      goto LAB_00250d37;
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pHVar7,
             parent);
LAB_00250d37:
  throwInternalCompilerError("! empty()","front",0xa7);
}

Assistant:

static void appendSpansForContent (choc::html::HTMLElement& parent, std::string_view markdown)
    {
        static const DelimiterType delimiterTypes[] =
        {
            {
                // `code`
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "`");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addChild ("code").addContent (text);
                }
            },
            {
                // _Emphasis_
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "_");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("em").setInline (true), text);
                }
            },
            {
                // **Bold**
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "**");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("strong").setInline (true), text);
                }
            },
            {
                // Links..
                [] (std::string_view text) -> DelimitedSection
                {
                    for (auto* proto : { "http:", "https:", "file:" })
                    {
                        auto start = text.find (proto);

                        if (start != std::string::npos)
                        {
                            auto end = text.find (' ', start);

                            if (end == std::string_view::npos) end = text.find ('\n', start);
                            if (end == std::string_view::npos) end = text.length();

                            return { start, end, 0 };
                        }
                    }

                    return {};
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addLink (text).addContent (text);
                }
            }
        };

        struct FoundDelimiter
        {
            DelimitedSection range;
            const DelimiterType* type;

            bool operator< (const FoundDelimiter& other) const    { return range.outerStart < other.range.outerStart; }
        };

        ArrayWithPreallocation<FoundDelimiter, 4> found;

        for (auto& type : delimiterTypes)
        {
            auto range = type.findNextMatch (markdown);

            if (range.outerEnd > range.outerStart)
                found.push_back ({ range, &type });
        }

        if (! found.empty())
        {
            std::sort (found.begin(), found.end());
            auto range = found.front().range;

            auto part1 = markdown.substr (0, range.outerStart);
            auto part2 = std::string (markdown.substr (range.outerStart + range.delimiterLength,
                                                       range.outerEnd - range.outerStart - range.delimiterLength * 2));
            auto part3 = markdown.substr (range.outerEnd);

            appendSpansForContent (parent, part1);
            found.front().type->addReplacementElement (parent, part2);
            appendSpansForContent (parent, part3);
            return;
        }

        if (! markdown.empty())
            parent.addContent (markdown);
    }